

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  _Bool _Var6;
  int iVar7;
  CHUNKcode CVar8;
  CURLcode CVar9;
  char *pcVar10;
  long local_128;
  char *local_118;
  char *auth;
  int iStack_e0;
  _Bool proxy;
  CHUNKcode r_1;
  int writetype;
  char letter;
  ssize_t tookcareof;
  CHUNKcode r;
  int i;
  char *line_start;
  char *ptr;
  ssize_t gotbytes;
  int keepon;
  int perline;
  size_t nread;
  char *hostheader;
  char *http;
  char *useragent;
  char *proxyconn;
  char *host;
  Curl_send_buffer *req_buffer;
  char *host_port;
  long lStack_60;
  int error;
  long check;
  _Bool chunked_encoding;
  long lStack_50;
  _Bool closeConnection;
  curl_off_t cl;
  curl_socket_t tunnelsocket;
  CURLcode result;
  SingleRequest *k;
  SessionHandle *data;
  int subversion;
  int remote_port_local;
  char *hostname_local;
  connectdata *pcStack_18;
  int sockindex_local;
  connectdata *conn_local;
  
  data._0_4_ = 0;
  k = (SingleRequest *)conn->data;
  _tunnelsocket = &((SessionHandle *)k)->req;
  cl._0_4_ = conn->sock[sockindex];
  lStack_50 = 0;
  check._7_1_ = 0;
  check._6_1_ = 0;
  host_port._4_4_ = 0;
  if (conn->tunnel_state[sockindex] == TUNNEL_COMPLETE) {
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    (conn->bits).proxy_connect_closed = false;
    data._4_4_ = remote_port;
    _subversion = hostname;
    hostname_local._4_4_ = sockindex;
    pcStack_18 = conn;
    do {
      if (pcStack_18->tunnel_state[hostname_local._4_4_] == TUNNEL_INIT) {
        Curl_infof((SessionHandle *)k,"Establish HTTP proxy tunnel to %s:%hu\n",_subversion,
                   (ulong)data._4_4_);
        if (k[1].now.tv_sec != 0) {
          (*Curl_cfree)((void *)k[1].now.tv_sec);
          k[1].now.tv_sec = 0;
        }
        host = (char *)Curl_add_buffer_init();
        if ((Curl_send_buffer *)host == (Curl_send_buffer *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        req_buffer = (Curl_send_buffer *)curl_maprintf("%s:%hu",_subversion,(ulong)data._4_4_);
        if (req_buffer == (Curl_send_buffer *)0x0) {
          (*Curl_cfree)(host);
          return CURLE_OUT_OF_MEMORY;
        }
        cl._4_4_ = Curl_http_output_auth(pcStack_18,"CONNECT",(char *)req_buffer,true);
        (*Curl_cfree)(req_buffer);
        if (cl._4_4_ == CURLE_OK) {
          proxyconn = "";
          useragent = "";
          http = "";
          hostheader = "1.1";
          if (pcStack_18->proxytype == CURLPROXY_HTTP_1_0) {
            hostheader = "1.0";
          }
          pcVar10 = "";
          if (((pcStack_18->bits).ipv6_ip & 1U) != 0) {
            pcVar10 = "[";
          }
          pcVar5 = "user=%s\x01auth=Bearer %s\x01\x01";
          if (((pcStack_18->bits).ipv6_ip & 1U) != 0) {
            pcVar5 = "%1023[^;\r\n =]=%4999[^;\r\n]";
          }
          nread = (size_t)curl_maprintf("%s%s%s:%hu",pcVar10,_subversion,pcVar5 + 0x18,
                                        (ulong)data._4_4_);
          if ((char *)nread == (char *)0x0) {
            (*Curl_cfree)(host);
            return CURLE_OUT_OF_MEMORY;
          }
          pcVar10 = Curl_checkProxyheaders(pcStack_18,"Host:");
          if ((pcVar10 == (char *)0x0) &&
             (proxyconn = curl_maprintf("Host: %s\r\n",nread), proxyconn == (char *)0x0)) {
            (*Curl_cfree)((void *)nread);
            (*Curl_cfree)(host);
            return CURLE_OUT_OF_MEMORY;
          }
          pcVar10 = Curl_checkProxyheaders(pcStack_18,"Proxy-Connection:");
          if (pcVar10 == (char *)0x0) {
            useragent = "Proxy-Connection: Keep-Alive\r\n";
          }
          pcVar10 = Curl_checkProxyheaders(pcStack_18,"User-Agent:");
          if ((pcVar10 == (char *)0x0) &&
             (lVar3._0_4_ = k[4].exp100, lVar3._4_4_ = k[4].upgr101, lVar3 != 0)) {
            http = (pcStack_18->allocptr).uagent;
          }
          if ((pcStack_18->allocptr).proxyuserpwd == (char *)0x0) {
            local_118 = "";
          }
          else {
            local_118 = (pcStack_18->allocptr).proxyuserpwd;
          }
          cl._4_4_ = Curl_add_bufferf((Curl_send_buffer *)host,"CONNECT %s HTTP/%s\r\n%s%s%s%s",
                                      nread,hostheader,proxyconn,local_118,http,useragent);
          if ((proxyconn != (char *)0x0) && (*proxyconn != '\0')) {
            (*Curl_cfree)(proxyconn);
          }
          (*Curl_cfree)((void *)nread);
          if (cl._4_4_ == CURLE_OK) {
            cl._4_4_ = Curl_add_custom_headers(pcStack_18,true,(Curl_send_buffer *)host);
          }
          if (cl._4_4_ == CURLE_OK) {
            cl._4_4_ = Curl_add_bufferf((Curl_send_buffer *)host,"\r\n");
          }
          if (cl._4_4_ == CURLE_OK) {
            cl._4_4_ = Curl_add_buffer_send
                                 ((Curl_send_buffer *)host,pcStack_18,&k[0x71].upload_present,0,
                                  hostname_local._4_4_);
          }
          host = (char *)0x0;
          if (cl._4_4_ != CURLE_OK) {
            Curl_failf((SessionHandle *)k,"Failed sending CONNECT to proxy");
          }
        }
        if (host != (char *)0x0) {
          (*Curl_cfree)(host);
          host = (char *)0x0;
        }
        if (cl._4_4_ != CURLE_OK) {
          return cl._4_4_;
        }
        pcStack_18->tunnel_state[hostname_local._4_4_] = TUNNEL_CONNECT;
      }
      lStack_60 = Curl_timeleft((SessionHandle *)k,(timeval *)0x0,true);
      if (lStack_60 < 1) {
        Curl_failf((SessionHandle *)k,"Proxy CONNECT aborted due to timeout");
        return CURLE_RECV_ERROR;
      }
      iVar7 = Curl_socket_check((curl_socket_t)cl,-1,-1,0);
      if (iVar7 == 0) {
        return CURLE_OK;
      }
      _r = &k[6].protop;
      _keepon = (char *)0x0;
      gotbytes._4_4_ = 0;
      gotbytes._0_4_ = 1;
      line_start = (char *)_r;
      while (_keepon < (char *)0x4000 && ((int)gotbytes != 0 && host_port._4_4_ == 0)) {
        lStack_60 = Curl_timeleft((SessionHandle *)k,(timeval *)0x0,true);
        if (lStack_60 < 1) {
          Curl_failf((SessionHandle *)k,"Proxy CONNECT aborted due to timeout");
          host_port._4_4_ = 2;
          break;
        }
        local_128 = lStack_60;
        if (999 < lStack_60) {
          local_128 = 1000;
        }
        iVar7 = Curl_socket_check((curl_socket_t)cl,-1,-1,local_128);
        if (iVar7 == -1) {
          host_port._4_4_ = 1;
          Curl_failf((SessionHandle *)k,"Proxy CONNECT aborted due to select/poll error");
          goto LAB_00148da1;
        }
        if (iVar7 == 0) goto LAB_00148da1;
        cl._4_4_ = Curl_read(pcStack_18,(curl_socket_t)cl,line_start,0x4000 - (long)_keepon,
                             (ssize_t *)&ptr);
        if (cl._4_4_ != CURLE_AGAIN) {
          if (cl._4_4_ == CURLE_OK) {
            if ((long)ptr < 1) {
              gotbytes._0_4_ = 0;
              lVar4._0_4_ = k[1].exp100;
              lVar4._4_4_ = k[1].upgr101;
              if ((lVar4 == 0) || (k[0x70].upload_present == 0)) {
                host_port._4_4_ = 1;
                Curl_failf((SessionHandle *)k,"Proxy CONNECT aborted");
              }
              else {
                (pcStack_18->bits).proxy_connect_closed = true;
                Curl_infof((SessionHandle *)k,"Proxy CONNECT connection closed");
              }
            }
            else {
              _keepon = ptr + (long)_keepon;
              if ((int)gotbytes < 2) {
                for (tookcareof._4_4_ = 0; (long)tookcareof._4_4_ < (long)ptr;
                    tookcareof._4_4_ = tookcareof._4_4_ + 1) {
                  gotbytes._4_4_ = gotbytes._4_4_ + 1;
                  if (*line_start == '\n') {
                    cl._4_4_ = 0;
                    if (((ulong)k[3].uploadbuf & 1) != 0) {
                      Curl_debug((SessionHandle *)k,CURLINFO_HEADER_IN,(char *)_r,
                                 (long)gotbytes._4_4_,pcStack_18);
                    }
                    iStack_e0 = 2;
                    if ((k[3].bodywrites & 0x100000000) != 0) {
                      iStack_e0 = 3;
                    }
                    cl._4_4_ = Curl_client_write(pcStack_18,iStack_e0,(char *)_r,
                                                 (long)gotbytes._4_4_);
                    k[0x71].newurl = k[0x71].newurl + gotbytes._4_4_;
                    k->offset = (long)gotbytes._4_4_ + k->offset;
                    if (cl._4_4_ != CURLE_OK) {
                      return cl._4_4_;
                    }
                    if ((*(char *)_r == '\r') || (*(char *)_r == '\n')) {
                      _keepon = (char *)0x0;
                      line_start = (char *)&k[6].protop;
                      if ((_tunnelsocket->httpcode == 0x197) && ((k[0x70].chunk & 1U) == 0)) {
                        gotbytes._0_4_ = 2;
                        if (lStack_50 == 0) {
                          if ((check._6_1_ & 1) == 0) {
                            gotbytes._0_4_ = 0;
                          }
                          else {
                            _tunnelsocket->ignorebody = true;
                            Curl_infof((SessionHandle *)k,"%zd bytes of chunk left\n",
                                       (long)ptr - (long)tookcareof._4_4_);
                            if (*(char *)((long)_r + 1) == '\n') {
                              _r = (void **)((long)_r + 1);
                              tookcareof._4_4_ = tookcareof._4_4_ + 1;
                            }
                            CVar8 = Curl_httpchunk_read(pcStack_18,(char *)((long)_r + 1),
                                                        (long)ptr - (long)tookcareof._4_4_,
                                                        (ssize_t *)&ptr);
                            if (CVar8 == CHUNKE_STOP) {
                              Curl_infof((SessionHandle *)k,"chunk reading DONE\n");
                              gotbytes._0_4_ = 0;
                              pcStack_18->tunnel_state[hostname_local._4_4_] = TUNNEL_COMPLETE;
                            }
                            else {
                              Curl_infof((SessionHandle *)k,"Read %zd bytes of chunk, continue\n",
                                         ptr);
                            }
                          }
                        }
                        else {
                          Curl_infof((SessionHandle *)k,"Ignore %ld bytes of response-body\n",
                                     lStack_50);
                          lStack_50 = lStack_50 - ((long)ptr - (long)tookcareof._4_4_);
                          if (lStack_50 < 1) {
                            gotbytes._0_4_ = 0;
                          }
                        }
                      }
                      else {
                        gotbytes._0_4_ = 0;
                        if ((*(int *)((long)&k[0x71].uploadbuf + 4) == 200) &&
                           (ptr != (char *)(long)(tookcareof._4_4_ + 1))) {
                          Curl_failf((SessionHandle *)k,
                                     "Proxy CONNECT followed by %zd bytes of opaque data. Data ignored (known bug #39)"
                                     ,(long)ptr - (long)(tookcareof._4_4_ + 1));
                        }
                      }
                      pcStack_18->tunnel_state[hostname_local._4_4_] = TUNNEL_COMPLETE;
                      break;
                    }
                    cVar1 = *(char *)((long)_r + (long)gotbytes._4_4_);
                    *(char *)((long)_r + (long)gotbytes._4_4_) = '\0';
                    iVar7 = Curl_raw_nequal("WWW-Authenticate:",(char *)_r,0x11);
                    if (((iVar7 == 0) || (_tunnelsocket->httpcode != 0x191)) &&
                       ((iVar7 = Curl_raw_nequal("Proxy-authenticate:",(char *)_r,0x13), iVar7 == 0
                        || (_tunnelsocket->httpcode != 0x197)))) {
                      iVar7 = Curl_raw_nequal("Content-Length:",(char *)_r,0xf);
                      if (iVar7 == 0) {
                        _Var6 = Curl_compareheader((char *)_r,"Connection:","close");
                        if (_Var6) {
                          check._7_1_ = 1;
                        }
                        else {
                          _Var6 = Curl_compareheader((char *)_r,"Transfer-Encoding:","chunked");
                          if (_Var6) {
                            Curl_infof((SessionHandle *)k,"CONNECT responded chunked\n");
                            check._6_1_ = 1;
                            Curl_httpchunk_init(pcStack_18);
                          }
                          else {
                            _Var6 = Curl_compareheader((char *)_r,"Proxy-Connection:","close");
                            if (_Var6) {
                              check._7_1_ = 1;
                            }
                            else {
                              iVar7 = __isoc99_sscanf(_r,"HTTP/1.%d %d",&data,
                                                      &_tunnelsocket->httpcode);
                              if (iVar7 == 2) {
                                *(int *)((long)&k[0x71].uploadbuf + 4) = _tunnelsocket->httpcode;
                              }
                            }
                          }
                        }
                      }
                      else {
                        lStack_50 = strtol((char *)((long)_r + 0xf),(char **)0x0,10);
                      }
                    }
                    else {
                      iVar7 = _tunnelsocket->httpcode;
                      pcVar10 = Curl_copy_header_value((char *)_r);
                      if (pcVar10 == (char *)0x0) {
                        return CURLE_OUT_OF_MEMORY;
                      }
                      cl._4_4_ = Curl_http_input_auth(pcStack_18,iVar7 == 0x197,pcVar10);
                      if (pcVar10 != (char *)0x0) {
                        (*Curl_cfree)(pcVar10);
                      }
                      if (cl._4_4_ != CURLE_OK) {
                        return cl._4_4_;
                      }
                    }
                    *(char *)((long)_r + (long)gotbytes._4_4_) = cVar1;
                    gotbytes._4_4_ = 0;
                    _r = (void **)(line_start + 1);
                  }
                  line_start = line_start + 1;
                }
              }
              else {
                _keepon = (char *)0x0;
                line_start = (char *)&k[6].protop;
                if (lStack_50 == 0) {
                  _writetype = 0;
                  tookcareof._0_4_ =
                       Curl_httpchunk_read(pcStack_18,line_start,(ssize_t)ptr,(ssize_t *)&writetype)
                  ;
                  if ((CHUNKcode)tookcareof == CHUNKE_STOP) {
                    Curl_infof((SessionHandle *)k,"chunk reading DONE\n");
                    gotbytes._0_4_ = 0;
                    pcStack_18->tunnel_state[hostname_local._4_4_] = TUNNEL_COMPLETE;
                  }
                  else {
                    Curl_infof((SessionHandle *)k,"Read %zd bytes of chunk, continue\n",_writetype);
                  }
                }
                else {
                  lStack_50 = lStack_50 - (long)ptr;
                  if (lStack_50 < 1) {
                    gotbytes._0_4_ = 0;
                  }
                }
              }
            }
          }
          else {
            gotbytes._0_4_ = 0;
          }
LAB_00148da1:
          iVar7 = Curl_pgrsUpdate(pcStack_18);
          if (iVar7 != 0) {
            return CURLE_ABORTED_BY_CALLBACK;
          }
        }
      }
      if (host_port._4_4_ != 0) {
        return CURLE_RECV_ERROR;
      }
      if (*(int *)((long)&k[0x71].uploadbuf + 4) != 200) {
        CVar9 = Curl_http_auth_act(pcStack_18);
        if (CVar9 != CURLE_OK) {
          return CVar9;
        }
        if (((pcStack_18->bits).close & 1U) != 0) {
          check._7_1_ = 1;
        }
        cl._4_4_ = CURLE_OK;
      }
      if (((check._7_1_ & 1) != 0) && (k[1].now.tv_sec != 0)) {
        Curl_closesocket(pcStack_18,pcStack_18->sock[hostname_local._4_4_]);
        pcStack_18->sock[hostname_local._4_4_] = -1;
        break;
      }
      if ((k[1].now.tv_sec != 0) &&
         (pcStack_18->tunnel_state[hostname_local._4_4_] == TUNNEL_COMPLETE)) {
        pcStack_18->tunnel_state[hostname_local._4_4_] = TUNNEL_INIT;
        Curl_infof((SessionHandle *)k,"TUNNEL_STATE switched to: %d\n",
                   (ulong)pcStack_18->tunnel_state[hostname_local._4_4_]);
      }
    } while (k[1].now.tv_sec != 0);
    iVar7._0_1_ = k->chunk;
    iVar7._1_1_ = k->upload_chunky;
    iVar7._2_1_ = k->getheader;
    iVar7._3_1_ = k->forbidchunk;
    if (iVar7 == 200) {
      pcStack_18->tunnel_state[hostname_local._4_4_] = TUNNEL_COMPLETE;
      if ((pcStack_18->allocptr).proxyuserpwd != (char *)0x0) {
        (*Curl_cfree)((pcStack_18->allocptr).proxyuserpwd);
        (pcStack_18->allocptr).proxyuserpwd = (char *)0x0;
      }
      (pcStack_18->allocptr).proxyuserpwd = (char *)0x0;
      *(undefined1 *)&k[0x70].upload_fromhere = 1;
      Curl_infof((SessionHandle *)k,"Proxy replied OK to CONNECT request\n");
      *(undefined1 *)((long)&k[1].start.tv_sec + 1) = 0;
      (pcStack_18->bits).rewindaftersend = false;
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      if (((check._7_1_ & 1) == 0) || (k[1].now.tv_sec == 0)) {
        if (k[1].now.tv_sec != 0) {
          (*Curl_cfree)((void *)k[1].now.tv_sec);
          k[1].now.tv_sec = 0;
        }
        (pcStack_18->bits).close = true;
        Curl_closesocket(pcStack_18,pcStack_18->sock[hostname_local._4_4_]);
        pcStack_18->sock[hostname_local._4_4_] = -1;
      }
      else {
        (pcStack_18->bits).proxy_connect_closed = true;
        Curl_infof((SessionHandle *)k,"Connect me again please\n");
      }
      pcStack_18->tunnel_state[hostname_local._4_4_] = TUNNEL_INIT;
      if (((pcStack_18->bits).proxy_connect_closed & 1U) == 0) {
        uVar2._0_1_ = k->chunk;
        uVar2._1_1_ = k->upload_chunky;
        uVar2._2_1_ = k->getheader;
        uVar2._3_1_ = k->forbidchunk;
        Curl_failf((SessionHandle *)k,"Received HTTP code %d from proxy after CONNECT",(ulong)uVar2)
        ;
        conn_local._4_4_ = CURLE_RECV_ERROR;
      }
      else {
        conn_local._4_4_ = CURLE_OK;
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  int subversion=0;
  struct SessionHandle *data=conn->data;
  struct SingleRequest *k = &data->req;
  CURLcode result;
  curl_socket_t tunnelsocket = conn->sock[sockindex];
  curl_off_t cl=0;
  bool closeConnection = FALSE;
  bool chunked_encoding = FALSE;
  long check;

#define SELECT_OK      0
#define SELECT_ERROR   1
#define SELECT_TIMEOUT 2
  int error = SELECT_OK;

  if(conn->tunnel_state[sockindex] == TUNNEL_COMPLETE)
    return CURLE_OK; /* CONNECT is already completed */

  conn->bits.proxy_connect_closed = FALSE;

  do {
    if(TUNNEL_INIT == conn->tunnel_state[sockindex]) {
      /* BEGIN CONNECT PHASE */
      char *host_port;
      Curl_send_buffer *req_buffer;

      infof(data, "Establish HTTP proxy tunnel to %s:%hu\n",
            hostname, remote_port);

      if(data->req.newurl) {
        /* This only happens if we've looped here due to authentication
           reasons, and we don't really use the newly cloned URL here
           then. Just free() it. */
        free(data->req.newurl);
        data->req.newurl = NULL;
      }

      /* initialize a dynamic send-buffer */
      req_buffer = Curl_add_buffer_init();

      if(!req_buffer)
        return CURLE_OUT_OF_MEMORY;

      host_port = aprintf("%s:%hu", hostname, remote_port);
      if(!host_port) {
        free(req_buffer);
        return CURLE_OUT_OF_MEMORY;
      }

      /* Setup the proxy-authorization header, if any */
      result = Curl_http_output_auth(conn, "CONNECT", host_port, TRUE);

      free(host_port);

      if(CURLE_OK == result) {
        char *host=(char *)"";
        const char *proxyconn="";
        const char *useragent="";
        const char *http = (conn->proxytype == CURLPROXY_HTTP_1_0) ?
          "1.0" : "1.1";
        char *hostheader= /* host:port with IPv6 support */
          aprintf("%s%s%s:%hu", conn->bits.ipv6_ip?"[":"",
                  hostname, conn->bits.ipv6_ip?"]":"",
                  remote_port);
        if(!hostheader) {
          free(req_buffer);
          return CURLE_OUT_OF_MEMORY;
        }

        if(!Curl_checkProxyheaders(conn, "Host:")) {
          host = aprintf("Host: %s\r\n", hostheader);
          if(!host) {
            free(hostheader);
            free(req_buffer);
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if(!Curl_checkProxyheaders(conn, "Proxy-Connection:"))
          proxyconn = "Proxy-Connection: Keep-Alive\r\n";

        if(!Curl_checkProxyheaders(conn, "User-Agent:") &&
           data->set.str[STRING_USERAGENT])
          useragent = conn->allocptr.uagent;

        result =
          Curl_add_bufferf(req_buffer,
                           "CONNECT %s HTTP/%s\r\n"
                           "%s"  /* Host: */
                           "%s"  /* Proxy-Authorization */
                           "%s"  /* User-Agent */
                           "%s", /* Proxy-Connection */
                           hostheader,
                           http,
                           host,
                           conn->allocptr.proxyuserpwd?
                           conn->allocptr.proxyuserpwd:"",
                           useragent,
                           proxyconn);

        if(host && *host)
          free(host);
        free(hostheader);

        if(CURLE_OK == result)
          result = Curl_add_custom_headers(conn, TRUE, req_buffer);

        if(CURLE_OK == result)
          /* CRLF terminate the request */
          result = Curl_add_bufferf(req_buffer, "\r\n");

        if(CURLE_OK == result) {
          /* Send the connect request to the proxy */
          /* BLOCKING */
          result =
            Curl_add_buffer_send(req_buffer, conn,
                                 &data->info.request_size, 0, sockindex);
        }
        req_buffer = NULL;
        if(result)
          failf(data, "Failed sending CONNECT to proxy");
      }

      Curl_safefree(req_buffer);
      if(result)
        return result;

      conn->tunnel_state[sockindex] = TUNNEL_CONNECT;
    } /* END CONNECT PHASE */

    check = Curl_timeleft(data, NULL, TRUE);
    if(check <= 0) {
      failf(data, "Proxy CONNECT aborted due to timeout");
      return CURLE_RECV_ERROR;
    }

    if(0 == Curl_socket_ready(tunnelsocket, CURL_SOCKET_BAD, 0))
      /* return so we'll be called again polling-style */
      return CURLE_OK;
    else {
      DEBUGF(infof(data,
                   "Read response immediately from proxy CONNECT\n"));
    }

    /* at this point, the tunnel_connecting phase is over. */

    { /* READING RESPONSE PHASE */
      size_t nread;   /* total size read */
      int perline; /* count bytes per line */
      int keepon=TRUE;
      ssize_t gotbytes;
      char *ptr;
      char *line_start;

      ptr=data->state.buffer;
      line_start = ptr;

      nread=0;
      perline=0;
      keepon=TRUE;

      while((nread<BUFSIZE) && (keepon && !error)) {

        check = Curl_timeleft(data, NULL, TRUE);
        if(check <= 0) {
          failf(data, "Proxy CONNECT aborted due to timeout");
          error = SELECT_TIMEOUT; /* already too little time */
          break;
        }

        /* loop every second at least, less if the timeout is near */
        switch (Curl_socket_ready(tunnelsocket, CURL_SOCKET_BAD,
                                  check<1000L?check:1000)) {
        case -1: /* select() error, stop reading */
          error = SELECT_ERROR;
          failf(data, "Proxy CONNECT aborted due to select/poll error");
          break;
        case 0: /* timeout */
          break;
        default:
          DEBUGASSERT(ptr+BUFSIZE-nread <= data->state.buffer+BUFSIZE+1);
          result = Curl_read(conn, tunnelsocket, ptr, BUFSIZE-nread,
                             &gotbytes);
          if(result==CURLE_AGAIN)
            continue; /* go loop yourself */
          else if(result)
            keepon = FALSE;
          else if(gotbytes <= 0) {
            keepon = FALSE;
            if(data->set.proxyauth && data->state.authproxy.avail) {
              /* proxy auth was requested and there was proxy auth available,
                 then deem this as "mere" proxy disconnect */
              conn->bits.proxy_connect_closed = TRUE;
              infof(data, "Proxy CONNECT connection closed");
            }
            else {
              error = SELECT_ERROR;
              failf(data, "Proxy CONNECT aborted");
            }
          }
          else {
            /*
             * We got a whole chunk of data, which can be anything from one
             * byte to a set of lines and possibly just a piece of the last
             * line.
             */
            int i;

            nread += gotbytes;

            if(keepon > TRUE) {
              /* This means we are currently ignoring a response-body */

              nread = 0; /* make next read start over in the read buffer */
              ptr=data->state.buffer;
              if(cl) {
                /* A Content-Length based body: simply count down the counter
                   and make sure to break out of the loop when we're done! */
                cl -= gotbytes;
                if(cl<=0) {
                  keepon = FALSE;
                  break;
                }
              }
              else {
                /* chunked-encoded body, so we need to do the chunked dance
                   properly to know when the end of the body is reached */
                CHUNKcode r;
                ssize_t tookcareof=0;

                /* now parse the chunked piece of data so that we can
                   properly tell when the stream ends */
                r = Curl_httpchunk_read(conn, ptr, gotbytes, &tookcareof);
                if(r == CHUNKE_STOP) {
                  /* we're done reading chunks! */
                  infof(data, "chunk reading DONE\n");
                  keepon = FALSE;
                  /* we did the full CONNECT treatment, go COMPLETE */
                  conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                }
                else
                  infof(data, "Read %zd bytes of chunk, continue\n",
                        tookcareof);
              }
            }
            else
              for(i = 0; i < gotbytes; ptr++, i++) {
                perline++; /* amount of bytes in this line so far */
                if(*ptr == 0x0a) {
                  char letter;
                  int writetype;

                  /* convert from the network encoding */
                  result = Curl_convert_from_network(data, line_start,
                                                     perline);
                  /* Curl_convert_from_network calls failf if unsuccessful */
                  if(result)
                    return result;

                  /* output debug if that is requested */
                  if(data->set.verbose)
                    Curl_debug(data, CURLINFO_HEADER_IN,
                               line_start, (size_t)perline, conn);

                  /* send the header to the callback */
                  writetype = CLIENTWRITE_HEADER;
                  if(data->set.include_header)
                    writetype |= CLIENTWRITE_BODY;

                  result = Curl_client_write(conn, writetype, line_start,
                                             perline);

                  data->info.header_size += (long)perline;
                  data->req.headerbytecount += (long)perline;

                  if(result)
                    return result;

                  /* Newlines are CRLF, so the CR is ignored as the line isn't
                     really terminated until the LF comes. Treat a following CR
                     as end-of-headers as well.*/

                  if(('\r' == line_start[0]) ||
                     ('\n' == line_start[0])) {
                    /* end of response-headers from the proxy */
                    nread = 0; /* make next read start over in the read
                                  buffer */
                    ptr=data->state.buffer;
                    if((407 == k->httpcode) && !data->state.authproblem) {
                      /* If we get a 407 response code with content length
                         when we have no auth problem, we must ignore the
                         whole response-body */
                      keepon = 2;

                      if(cl) {
                        infof(data, "Ignore %" CURL_FORMAT_CURL_OFF_T
                              " bytes of response-body\n", cl);

                        /* remove the remaining chunk of what we already
                           read */
                        cl -= (gotbytes - i);

                        if(cl<=0)
                          /* if the whole thing was already read, we are done!
                           */
                          keepon=FALSE;
                      }
                      else if(chunked_encoding) {
                        CHUNKcode r;
                        /* We set ignorebody true here since the chunked
                           decoder function will acknowledge that. Pay
                           attention so that this is cleared again when this
                           function returns! */
                        k->ignorebody = TRUE;
                        infof(data, "%zd bytes of chunk left\n", gotbytes-i);

                        if(line_start[1] == '\n') {
                          /* this can only be a LF if the letter at index 0
                             was a CR */
                          line_start++;
                          i++;
                        }

                        /* now parse the chunked piece of data so that we can
                           properly tell when the stream ends */
                        r = Curl_httpchunk_read(conn, line_start+1,
                                                  gotbytes -i, &gotbytes);
                        if(r == CHUNKE_STOP) {
                          /* we're done reading chunks! */
                          infof(data, "chunk reading DONE\n");
                          keepon = FALSE;
                          /* we did the full CONNECT treatment, go to
                             COMPLETE */
                          conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                        }
                        else
                          infof(data, "Read %zd bytes of chunk, continue\n",
                                gotbytes);
                      }
                      else {
                        /* without content-length or chunked encoding, we
                           can't keep the connection alive since the close is
                           the end signal so we bail out at once instead */
                        keepon=FALSE;
                      }
                    }
                    else {
                      keepon = FALSE;
                      if(200 == data->info.httpproxycode) {
                        if(gotbytes - (i+1))
                          failf(data, "Proxy CONNECT followed by %zd bytes "
                                "of opaque data. Data ignored (known bug #39)",
                                gotbytes - (i+1));
                      }
                    }
                    /* we did the full CONNECT treatment, go to COMPLETE */
                    conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                    break; /* breaks out of for-loop, not switch() */
                  }

                  /* keep a backup of the position we are about to blank */
                  letter = line_start[perline];
                  line_start[perline]=0; /* zero terminate the buffer */
                  if((checkprefix("WWW-Authenticate:", line_start) &&
                      (401 == k->httpcode)) ||
                     (checkprefix("Proxy-authenticate:", line_start) &&
                      (407 == k->httpcode))) {

                    bool proxy = (k->httpcode == 407) ? TRUE : FALSE;
                    char *auth = Curl_copy_header_value(line_start);
                    if(!auth)
                      return CURLE_OUT_OF_MEMORY;

                    result = Curl_http_input_auth(conn, proxy, auth);

                    Curl_safefree(auth);

                    if(result)
                      return result;
                  }
                  else if(checkprefix("Content-Length:", line_start)) {
                    cl = curlx_strtoofft(line_start +
                                         strlen("Content-Length:"), NULL, 10);
                  }
                  else if(Curl_compareheader(line_start,
                                             "Connection:", "close"))
                    closeConnection = TRUE;
                  else if(Curl_compareheader(line_start,
                                             "Transfer-Encoding:",
                                             "chunked")) {
                    infof(data, "CONNECT responded chunked\n");
                    chunked_encoding = TRUE;
                    /* init our chunky engine */
                    Curl_httpchunk_init(conn);
                  }
                  else if(Curl_compareheader(line_start,
                                             "Proxy-Connection:", "close"))
                    closeConnection = TRUE;
                  else if(2 == sscanf(line_start, "HTTP/1.%d %d",
                                      &subversion,
                                      &k->httpcode)) {
                    /* store the HTTP code from the proxy */
                    data->info.httpproxycode = k->httpcode;
                  }
                  /* put back the letter we blanked out before */
                  line_start[perline]= letter;

                  perline=0; /* line starts over here */
                  line_start = ptr+1; /* this skips the zero byte we wrote */
                }
              }
          }
          break;
        } /* switch */
        if(Curl_pgrsUpdate(conn))
          return CURLE_ABORTED_BY_CALLBACK;
      } /* while there's buffer left and loop is requested */

      if(error)
        return CURLE_RECV_ERROR;

      if(data->info.httpproxycode != 200) {
        /* Deal with the possibly already received authenticate
           headers. 'newurl' is set to a new URL if we must loop. */
        result = Curl_http_auth_act(conn);
        if(result)
          return result;

        if(conn->bits.close)
          /* the connection has been marked for closure, most likely in the
             Curl_http_auth_act() function and thus we can kill it at once
             below
          */
          closeConnection = TRUE;
      }

      if(closeConnection && data->req.newurl) {
        /* Connection closed by server. Don't use it anymore */
        Curl_closesocket(conn, conn->sock[sockindex]);
        conn->sock[sockindex] = CURL_SOCKET_BAD;
        break;
      }
    } /* END READING RESPONSE PHASE */

    /* If we are supposed to continue and request a new URL, which basically
     * means the HTTP authentication is still going on so if the tunnel
     * is complete we start over in INIT state */
    if(data->req.newurl &&
       (TUNNEL_COMPLETE == conn->tunnel_state[sockindex])) {
      conn->tunnel_state[sockindex] = TUNNEL_INIT;
      infof(data, "TUNNEL_STATE switched to: %d\n",
            conn->tunnel_state[sockindex]);
    }

  } while(data->req.newurl);

  if(200 != data->req.httpcode) {
    if(closeConnection && data->req.newurl) {
      conn->bits.proxy_connect_closed = TRUE;
      infof(data, "Connect me again please\n");
    }
    else {
      if(data->req.newurl) {
        /* this won't be used anymore for the CONNECT so free it now */
        free(data->req.newurl);
        data->req.newurl = NULL;
      }
      /* failure, close this connection to avoid re-use */
      connclose(conn, "proxy CONNECT failure");
      Curl_closesocket(conn, conn->sock[sockindex]);
      conn->sock[sockindex] = CURL_SOCKET_BAD;
    }

    /* to back to init state */
    conn->tunnel_state[sockindex] = TUNNEL_INIT;

    if(conn->bits.proxy_connect_closed)
      /* this is not an error, just part of the connection negotiation */
      return CURLE_OK;
    else {
      failf(data, "Received HTTP code %d from proxy after CONNECT",
            data->req.httpcode);
      return CURLE_RECV_ERROR;
    }
  }

  conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;

  /* If a proxy-authorization header was used for the proxy, then we should
     make sure that it isn't accidentally used for the document request
     after we've connected. So let's free and clear it here. */
  Curl_safefree(conn->allocptr.proxyuserpwd);
  conn->allocptr.proxyuserpwd = NULL;

  data->state.authproxy.done = TRUE;

  infof (data, "Proxy replied OK to CONNECT request\n");
  data->req.ignorebody = FALSE; /* put it (back) to non-ignore state */
  conn->bits.rewindaftersend = FALSE; /* make sure this isn't set for the
                                         document request  */
  return CURLE_OK;
}